

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

bool __thiscall
Memory::HeapBlockMap32::EnsureHeapBlock(HeapBlockMap32 *this,void *address,uint pageCount)

{
  HeapAllocator *pHVar1;
  L2MapChunk *this_00;
  ulong uVar2;
  uint uVar3;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  uVar2 = (ulong)address >> 0x14 & 0xfff;
  uVar3 = 0x100 - ((uint)address >> 0xc & 0xff);
  if (pageCount <= uVar3) {
    uVar3 = pageCount;
  }
  while( true ) {
    if (this->map[uVar2] == (L2MapChunk *)0x0) {
      pHVar1 = HeapAllocator::GetNoMemProtectInstance();
      local_58 = (undefined1  [8])&L2MapChunk::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_26e76d1;
      data.filename._0_4_ = 0x44;
      pHVar1 = HeapAllocator::TrackAllocInfo(pHVar1,(TrackAllocData *)local_58);
      this_00 = (L2MapChunk *)HeapAllocator::AllocT<true>(pHVar1,0x2c08);
      if (this_00 == (L2MapChunk *)0x0) {
        L2MapChunk::L2MapChunk((L2MapChunk *)0x0);
        return false;
      }
      memset(this_00,0,0x2c08);
      L2MapChunk::L2MapChunk(this_00);
      this->map[uVar2] = this_00;
      this->count = this->count + 1;
    }
    pageCount = pageCount - uVar3;
    if (pageCount == 0) break;
    uVar2 = (ulong)((int)uVar2 + 1);
    uVar3 = 0x100;
    if (pageCount < 0x100) {
      uVar3 = pageCount;
    }
  }
  return true;
}

Assistant:

bool
HeapBlockMap32::EnsureHeapBlock(void * address, uint pageCount)
{
    uint id1 = GetLevel1Id(address);
    uint id2 = GetLevel2Id(address);

    uint currentPageCount = min(pageCount, L2Count - id2);

    while (true)
    {
        if (map[id1] == nullptr)
        {
            L2MapChunk * newChunk = NoMemProtectHeapNewNoThrowZ(L2MapChunk);
            if (newChunk == nullptr)
            {
                // Leave any previously allocated L2MapChunks in place --
                // the concurrent thread may have already accessed them.
                // These will be cleaned up in the Cleanup method, after Sweep is complete.
                return false;
            }

            map[id1] = newChunk;
            count++;
        }

        pageCount -= currentPageCount;
        if (pageCount == 0)
        {
            break;
        }

        id2 = 0;
        id1++;
        currentPageCount = min(pageCount, L2Count);
    }

    return true;
}